

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpcb_st_xdr.c
# Opt level: O3

_Bool xdr_rpcbs_rmtcalllist(XDR *xdrs,rpcbs_rmtcalllist *objp)

{
  xdr_op xVar1;
  uint uVar2;
  _Bool _Var3;
  char cVar4;
  bool_t bVar5;
  uint *puVar6;
  uint *puVar7;
  ulong uVar8;
  uint *puVar9;
  u_int __maxsize;
  uint *puVar10;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  undefined8 uVar11;
  char *pcVar12;
  
  xVar1 = xdrs->x_op;
  if (xVar1 == XDR_FREE) {
    bVar5 = xdr_int32_t((XDR *)xdrs,&objp->indirect);
    if ((char)bVar5 == '\0') {
      return false;
    }
    bVar5 = xdr_string((XDR *)xdrs,&objp->netid,__maxsize);
    cVar4 = (char)bVar5;
    goto LAB_001192b3;
  }
  if (xVar1 == XDR_DECODE) {
    puVar10 = (uint *)xdrs->x_data;
    puVar6 = (uint *)(xdrs->x_v).vio_tail;
    puVar7 = puVar10 + 6;
    puVar9 = puVar10;
    if ((puVar6 < puVar7) ||
       (xdrs->x_data = (uint8_t *)puVar7, puVar9 = puVar7, puVar10 == (uint *)0x0)) {
      puVar7 = puVar9 + 1;
      if (puVar6 < puVar7) {
        _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,&objp->prog);
        if (!_Var3) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar12 = "%s:%u ERROR prog";
          uVar11 = 0x91;
          goto LAB_00119346;
        }
        puVar7 = (uint *)xdrs->x_data;
        puVar6 = (uint *)(xdrs->x_v).vio_tail;
      }
      else {
        uVar2 = *puVar9;
        objp->prog = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
        ;
        xdrs->x_data = (uint8_t *)puVar7;
      }
      puVar10 = puVar7 + 1;
      if (puVar6 < puVar10) {
        _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,&objp->vers);
        if (!_Var3) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar12 = "%s:%u ERROR vers";
          uVar11 = 0x96;
          goto LAB_00119346;
        }
        puVar10 = (uint *)xdrs->x_data;
        puVar6 = (uint *)(xdrs->x_v).vio_tail;
      }
      else {
        uVar2 = *puVar7;
        objp->vers = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
        ;
        xdrs->x_data = (uint8_t *)puVar10;
      }
      puVar7 = puVar10 + 1;
      if (puVar6 < puVar7) {
        _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,&objp->proc);
        if (!_Var3) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar12 = "%s:%u ERROR proc";
          uVar11 = 0x9b;
          goto LAB_00119346;
        }
        puVar7 = (uint *)xdrs->x_data;
        puVar6 = (uint *)(xdrs->x_v).vio_tail;
      }
      else {
        uVar2 = *puVar10;
        objp->proc = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
        ;
        xdrs->x_data = (uint8_t *)puVar7;
      }
      puVar10 = puVar7 + 1;
      if (puVar6 < puVar10) {
        _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)&objp->success);
        if (!_Var3) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar12 = "%s:%u ERROR success";
          uVar11 = 0xa0;
          goto LAB_00119346;
        }
        puVar10 = (uint *)xdrs->x_data;
        puVar6 = (uint *)(xdrs->x_v).vio_tail;
      }
      else {
        uVar2 = *puVar7;
        objp->success =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        xdrs->x_data = (uint8_t *)puVar10;
      }
      puVar9 = puVar10 + 1;
      if (puVar6 < puVar9) {
        _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)&objp->failure);
        if (!_Var3) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar12 = "%s:%u ERROR failure";
          uVar11 = 0xa5;
          goto LAB_00119346;
        }
        puVar9 = (uint *)xdrs->x_data;
        puVar6 = (uint *)(xdrs->x_v).vio_tail;
      }
      else {
        uVar2 = *puVar10;
        objp->failure =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        xdrs->x_data = (uint8_t *)puVar9;
      }
      puVar7 = puVar9 + 1;
      if (puVar6 < puVar7) {
        _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)&objp->indirect);
        puVar7 = extraout_RDX;
        if (!_Var3) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar12 = "%s:%u ERROR indirect";
          uVar11 = 0xaa;
LAB_00119346:
          (*__ntirpc_pkg_params.warnx_)(pcVar12,"xdr_rpcbs_rmtcalllist",uVar11);
          return false;
        }
      }
      else {
        uVar2 = *puVar9;
        objp->indirect =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        xdrs->x_data = (uint8_t *)puVar7;
      }
    }
    else {
      uVar2 = *puVar10;
      objp->prog = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar2 = puVar10[1];
      objp->vers = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar2 = puVar10[2];
      objp->proc = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar2 = puVar10[3];
      objp->success =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar2 = puVar10[4];
      objp->failure =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar2 = puVar10[5];
      objp->indirect =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    }
    cVar4 = xdr_string_decode(xdrs,&objp->netid,(u_int)puVar7);
    goto LAB_001192b3;
  }
  if (xVar1 != XDR_ENCODE) {
    return false;
  }
  puVar10 = (uint *)xdrs->x_data;
  puVar6 = (uint *)(xdrs->x_v).vio_wrap;
  puVar7 = puVar10 + 6;
  puVar9 = puVar10;
  if (puVar6 < puVar7) {
LAB_00118f22:
    uVar2 = objp->prog;
    puVar7 = puVar9 + 1;
    if (puVar6 < puVar7) {
      _Var3 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
      if (!_Var3) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        uVar8 = (ulong)objp->prog;
        pcVar12 = "%s:%u ERROR prog %u";
        uVar11 = 0x59;
        goto LAB_00119370;
      }
      puVar7 = (uint *)xdrs->x_data;
      puVar6 = (uint *)(xdrs->x_v).vio_wrap;
    }
    else {
      *puVar9 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      xdrs->x_data = (uint8_t *)puVar7;
    }
    uVar2 = objp->vers;
    puVar10 = puVar7 + 1;
    if (puVar6 < puVar10) {
      _Var3 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
      if (!_Var3) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        uVar8 = (ulong)objp->vers;
        pcVar12 = "%s:%u ERROR vers %u";
        uVar11 = 0x5f;
        goto LAB_00119370;
      }
      puVar10 = (uint *)xdrs->x_data;
      puVar6 = (uint *)(xdrs->x_v).vio_wrap;
    }
    else {
      *puVar7 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      xdrs->x_data = (uint8_t *)puVar10;
    }
    uVar2 = objp->proc;
    puVar7 = puVar10 + 1;
    if (puVar6 < puVar7) {
      _Var3 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
      if (!_Var3) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        uVar8 = (ulong)objp->proc;
        pcVar12 = "%s:%u ERROR proc %u";
        uVar11 = 0x65;
        goto LAB_00119370;
      }
      puVar7 = (uint *)xdrs->x_data;
      puVar6 = (uint *)(xdrs->x_v).vio_wrap;
    }
    else {
      *puVar10 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      xdrs->x_data = (uint8_t *)puVar7;
    }
    uVar2 = objp->success;
    puVar10 = puVar7 + 1;
    if (puVar6 < puVar10) {
      _Var3 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
      if (!_Var3) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        uVar8 = (ulong)(uint)objp->success;
        pcVar12 = "%s:%u ERROR success %u";
        uVar11 = 0x6b;
        goto LAB_00119370;
      }
      puVar10 = (uint *)xdrs->x_data;
      puVar6 = (uint *)(xdrs->x_v).vio_wrap;
    }
    else {
      *puVar7 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      xdrs->x_data = (uint8_t *)puVar10;
    }
    uVar2 = objp->failure;
    puVar9 = puVar10 + 1;
    if (puVar6 < puVar9) {
      _Var3 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
      if (!_Var3) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        uVar8 = (ulong)(uint)objp->failure;
        pcVar12 = "%s:%u ERROR failure %u";
        uVar11 = 0x71;
        goto LAB_00119370;
      }
      puVar9 = (uint *)xdrs->x_data;
      puVar6 = (uint *)(xdrs->x_v).vio_wrap;
    }
    else {
      *puVar10 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      xdrs->x_data = (uint8_t *)puVar9;
    }
    uVar2 = objp->indirect;
    puVar7 = puVar9 + 1;
    if (puVar6 < puVar7) {
      _Var3 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
      puVar7 = extraout_RDX_00;
      if (!_Var3) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        uVar8 = (ulong)(uint)objp->indirect;
        pcVar12 = "%s:%u ERROR indirect %u";
        uVar11 = 0x77;
LAB_00119370:
        (*__ntirpc_pkg_params.warnx_)(pcVar12,"xdr_rpcbs_rmtcalllist",uVar11,uVar8);
        return false;
      }
    }
    else {
      *puVar9 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      xdrs->x_data = (uint8_t *)puVar7;
    }
  }
  else {
    xdrs->x_data = (uint8_t *)puVar7;
    if ((xdrs->x_v).vio_tail < puVar7) {
      (xdrs->x_v).vio_tail = (uint8_t *)puVar7;
      *(uint **)((long)xdrs->x_base + 0x10) = puVar7;
    }
    puVar9 = puVar7;
    if (puVar10 == (uint *)0x0) goto LAB_00118f22;
    uVar2 = objp->prog;
    *puVar10 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = objp->vers;
    puVar10[1] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = objp->proc;
    puVar10[2] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = objp->success;
    puVar10[3] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = objp->failure;
    puVar10[4] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = objp->indirect;
    puVar10[5] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  }
  cVar4 = xdr_string_encode(xdrs,&objp->netid,(u_int)puVar7);
LAB_001192b3:
  if (cVar4 == '\0') {
    return false;
  }
  bVar5 = xdr_pointer((XDR *)xdrs,(char **)&objp->next,0x28,xdr_rpcbs_rmtcalllist);
  return SUB41(bVar5,0);
}

Assistant:

bool
xdr_rpcbs_rmtcalllist(XDR *xdrs, rpcbs_rmtcalllist *objp)
{
	int32_t *buf;

	if (xdrs->x_op == XDR_ENCODE) {
		buf = xdr_inline_encode(xdrs, 6 * BYTES_PER_XDR_UNIT);
		if (buf != NULL) {
			/* most likely */
			IXDR_PUT_U_INT32(buf, objp->prog);
			IXDR_PUT_U_INT32(buf, objp->vers);
			IXDR_PUT_U_INT32(buf, objp->proc);
			IXDR_PUT_INT32(buf, objp->success);
			IXDR_PUT_INT32(buf, objp->failure);
			IXDR_PUT_INT32(buf, objp->indirect);
		} else if (!XDR_PUTUINT32(xdrs, objp->prog)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR prog %u",
				__func__, __LINE__,
				objp->prog);
			return (false);
		} else if (!XDR_PUTUINT32(xdrs, objp->vers)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR vers %u",
				__func__, __LINE__,
				objp->vers);
			return (false);
		} else if (!XDR_PUTUINT32(xdrs, objp->proc)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR proc %u",
				__func__, __LINE__,
				objp->proc);
			return (false);
		} else if (!XDR_PUTINT32(xdrs, objp->success)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR success %u",
				__func__, __LINE__,
				objp->success);
			return (false);
		} else if (!XDR_PUTINT32(xdrs, objp->failure)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR failure %u",
				__func__, __LINE__,
				objp->failure);
			return (false);
		} else if (!XDR_PUTINT32(xdrs, objp->indirect)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR indirect %u",
				__func__, __LINE__,
				objp->indirect);
			return (false);
		}
		if (!xdr_string_encode(xdrs, &objp->netid, RPC_MAXDATASIZE))
			return (false);
		if (!xdr_pointer(xdrs, (void **)&objp->next,
				 sizeof(rpcbs_rmtcalllist),
				 (xdrproc_t) xdr_rpcbs_rmtcalllist))
			return (false);
		return (true);
	}

	if (xdrs->x_op == XDR_DECODE) {
		buf = xdr_inline_decode(xdrs, 6 * BYTES_PER_XDR_UNIT);
		if (buf != NULL) {
			/* most likely */
			objp->prog = (rpcprog_t) IXDR_GET_U_INT32(buf);
			objp->vers = (rpcvers_t) IXDR_GET_U_INT32(buf);
			objp->proc = (rpcproc_t) IXDR_GET_U_INT32(buf);
			objp->success = (int)IXDR_GET_INT32(buf);
			objp->failure = (int)IXDR_GET_INT32(buf);
			objp->indirect = (int)IXDR_GET_INT32(buf);
		} else if (!XDR_GETUINT32(xdrs, &(objp->prog))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR prog",
				__func__, __LINE__);
			return (false);
		} else if (!XDR_GETUINT32(xdrs, &(objp->vers))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR vers",
				__func__, __LINE__);
			return (false);
		} else if (!XDR_GETUINT32(xdrs, &(objp->proc))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR proc",
				__func__, __LINE__);
			return (false);
		} else if (!XDR_GETINT32(xdrs, &(objp->success))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR success",
				__func__, __LINE__);
			return (false);
		} else if (!XDR_GETINT32(xdrs, &(objp->failure))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR failure",
				__func__, __LINE__);
			return (false);
		} else if (!XDR_GETINT32(xdrs, &(objp->indirect))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR indirect",
				__func__, __LINE__);
			return (false);
		}
		if (!xdr_string_decode(xdrs, &objp->netid, RPC_MAXDATASIZE))
			return (false);
		if (!xdr_pointer(xdrs, (void **)&objp->next,
				 sizeof(rpcbs_rmtcalllist),
				 (xdrproc_t) xdr_rpcbs_rmtcalllist))
			return (false);
		return (true);
	}

	if (!xdr_u_int32_t(xdrs, &objp->prog))
		return (false);
	if (!xdr_u_int32_t(xdrs, &objp->vers))
		return (false);
	if (!xdr_u_int32_t(xdrs, &objp->proc))
		return (false);
	if (!xdr_int32_t(xdrs, &objp->success))
		return (false);
	if (!xdr_int32_t(xdrs, &objp->failure))
		return (false);
	if (!xdr_int32_t(xdrs, &objp->indirect))
		return (false);
	if (!xdr_string(xdrs, &objp->netid, RPC_MAXDATASIZE))
		return (false);
	if (!xdr_pointer(xdrs, (void **)&objp->next,
			 sizeof(rpcbs_rmtcalllist),
			 (xdrproc_t) xdr_rpcbs_rmtcalllist))
		return (false);

	return (true);
}